

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

void __thiscall
wabt::Decompiler::LoadStore
          (Decompiler *this,Value *val,Node *addr_exp,uint64_t offset,Opcode opc,Address align,
          Type op_type)

{
  LoadStoreTracking *this_00;
  short sVar1;
  Expr *pEVar2;
  Module *pMVar3;
  pointer ppDVar4;
  DataSegment *pDVar5;
  pointer pcVar6;
  pointer pNVar7;
  Node *n;
  undefined8 uVar8;
  char cVar9;
  int iVar10;
  Enum EVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  ulong uVar15;
  char *__function;
  pointer puVar16;
  char cVar17;
  pointer puVar18;
  _Alloc_hider _Var19;
  Opcode OVar20;
  undefined4 in_register_00000084;
  char cVar21;
  Enum EVar22;
  pointer ppDVar23;
  Address AVar24;
  string index;
  Value ival;
  string __str;
  string access;
  string local_138;
  undefined1 local_118 [40];
  string local_f0;
  undefined1 local_d0 [48];
  Address local_a0;
  LoadStoreTracking *local_88;
  size_type local_80;
  long *local_78;
  undefined8 uStack_70;
  long local_68 [2];
  string local_58;
  char *local_38;
  
  this_00 = &this->lst;
  OVar20.enum_ = opc.enum_;
  LoadStoreTracking::GenAccess_abi_cxx11_(&local_58,this_00,offset,addr_exp);
  if ((local_58._M_string_length == 0) ||
     (iVar10 = std::__cxx11::string::compare((char *)&local_58), iVar10 == 0)) {
    pEVar2 = addr_exp->e;
    local_80 = local_58._M_string_length;
    if ((pEVar2 == (Expr *)0x0) || (pEVar2->type_ != Const)) {
LAB_00136f80:
      uVar12 = 0;
      bVar14 = false;
    }
    else {
      iVar10 = *(int *)&pEVar2[1].loc.filename._M_str;
      if (iVar10 == -2) {
        uVar12 = *(ulong *)((long)&pEVar2[1].loc.field_1 + 8);
      }
      else {
        if (iVar10 != -1) goto LAB_00136f80;
        uVar12 = (ulong)(uint)pEVar2[1].loc.field_1.field_0.last_column;
      }
      bVar14 = true;
    }
    local_88 = this_00;
    if (bVar14) {
      pMVar3 = (this->mc).module;
      ppDVar23 = (pMVar3->data_segments).
                 super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppDVar4 = (pMVar3->data_segments).
                super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (ppDVar23 != ppDVar4) {
        puVar18 = (pointer)(uVar12 + offset);
        do {
          pDVar5 = *ppDVar23;
          if ((pDVar5->offset).size_ == 1) {
            pEVar2 = (pDVar5->offset).first_;
            bVar14 = true;
            if ((pEVar2 == (Expr *)0x0) || (pEVar2->type_ != Const)) {
LAB_00136ffc:
              puVar16 = (pointer)0x0;
            }
            else {
              iVar10 = *(int *)&pEVar2[1].loc.filename._M_str;
              if (iVar10 == -2) {
                puVar16 = *(pointer *)((long)&pEVar2[1].loc.field_1 + 8);
              }
              else {
                if (iVar10 != -1) goto LAB_00136ffc;
                puVar16 = (pointer)(ulong)(uint)pEVar2[1].loc.field_1.field_0.last_column;
              }
              bVar14 = false;
            }
            if (((!bVar14) && (puVar16 <= puVar18)) &&
               (puVar18 < (pDVar5->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                          ((long)puVar16 -
                          (long)(pDVar5->data).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start))) {
              local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
              pcVar6 = (pDVar5->name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,pcVar6,pcVar6 + (pDVar5->name)._M_string_length);
              local_68[0] = 0;
              local_78 = (long *)0x0;
              uStack_70 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_78,&local_138,local_118);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_d0,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_78);
              local_d0._24_4_ = Atomic;
              local_118._0_8_ =
                   (val->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_118._8_8_ =
                   (val->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_118._16_8_ =
                   (val->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d0._0_8_;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d0._8_8_;
              (val->v).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d0._16_8_;
              local_d0._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_d0._8_8_ = (pointer)0x0;
              local_d0._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_118);
              val->precedence = local_d0._24_4_;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_d0);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_78);
              offset = (long)puVar18 - (long)puVar16;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                (ulong)(local_138.field_2._M_allocated_capacity + 1));
              }
            }
          }
          ppDVar23 = ppDVar23 + 1;
        } while (ppDVar23 != ppDVar4);
      }
    }
    uVar12 = offset / align;
    if (offset % align == 0) {
      cVar17 = '\x01';
      if (9 < uVar12) {
        uVar15 = uVar12;
        cVar21 = '\x04';
        do {
          cVar17 = cVar21;
          if (uVar15 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00137327;
          }
          if (uVar15 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00137327;
          }
          if (uVar15 < 10000) goto LAB_00137327;
          bVar14 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar21 = cVar17 + '\x04';
        } while (bVar14);
        cVar17 = cVar17 + '\x01';
      }
LAB_00137327:
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_138,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (local_138._M_dataplus._M_p,(uint)local_138._M_string_length,uVar12);
    }
    else {
      cVar21 = '\x01';
      cVar17 = '\x01';
      if (9 < offset) {
        uVar12 = offset;
        cVar9 = '\x04';
        do {
          cVar17 = cVar9;
          if (uVar12 < 100) {
            cVar17 = cVar17 + -2;
            goto LAB_00137250;
          }
          if (uVar12 < 1000) {
            cVar17 = cVar17 + -1;
            goto LAB_00137250;
          }
          if (uVar12 < 10000) goto LAB_00137250;
          bVar14 = 99999 < uVar12;
          uVar12 = uVar12 / 10000;
          cVar9 = cVar17 + '\x04';
        } while (bVar14);
        cVar17 = cVar17 + '\x01';
      }
LAB_00137250:
      local_118._0_8_ = local_118 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_118,cVar17);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_118._0_8_,local_118._8_4_,offset);
      if (9 < align) {
        AVar24 = align;
        cVar17 = '\x04';
        do {
          cVar21 = cVar17;
          if (AVar24 < 100) {
            cVar21 = cVar21 + -2;
            goto LAB_001372d0;
          }
          if (AVar24 < 1000) {
            cVar21 = cVar21 + -1;
            goto LAB_001372d0;
          }
          if (AVar24 < 10000) goto LAB_001372d0;
          bVar14 = 99999 < AVar24;
          AVar24 = AVar24 / 10000;
          cVar17 = cVar21 + '\x04';
        } while (bVar14);
        cVar21 = cVar21 + '\x01';
      }
LAB_001372d0:
      local_78 = local_68;
      std::__cxx11::string::_M_construct((ulong)&local_78,cVar21);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,(uint)uStack_70,align);
      cat<std::__cxx11::string,char[2],std::__cxx11::string>
                (&local_138,(wabt *)local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"@",
                 (char (*) [2])&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,OVar20.enum_));
    }
    if (offset % align != 0) {
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      if ((pointer)local_118._0_8_ != (pointer)(local_118 + 0x10)) {
        operator_delete((void *)local_118._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
      }
    }
    if (addr_exp->etype != Binary) goto LAB_0013750b;
    if (addr_exp->e->type_ != Binary) {
LAB_001377de:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::OpcodeExpr<wabt::ExprType::Binary>, Base = wabt::Expr]"
      ;
      goto LAB_001377f3;
    }
    if ((*(int *)&addr_exp->e->field_0x3c != 0x62) ||
       (pNVar7 = (addr_exp->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>.
                 _M_impl.super__Vector_impl_data._M_start, pNVar7[1].etype != Binary))
    goto LAB_0013750b;
    if ((pNVar7[1].e)->type_ != Binary) goto LAB_001377de;
    if ((*(int *)&(pNVar7[1].e)->field_0x3c == 0x6c) &&
       (n = pNVar7[1].children.super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
            super__Vector_impl_data._M_start, n[1].etype == Const)) {
      pEVar2 = n[1].e;
      if (pEVar2->type_ == Const) {
        if ((*(int *)&pEVar2[1].loc.filename._M_str == -1) &&
           (1L << (pEVar2[1].loc.field_1.field2[8] & 0x3f) == align)) {
          DecompileExpr((Value *)local_d0,this,n,pNVar7 + 1);
          if (local_d0._8_8_ - local_d0._0_8_ == 0x20) {
            if (offset == 0) {
              std::__cxx11::string::_M_assign((string *)&local_138);
            }
            else {
              BracketIfNeeded(this,(Value *)local_d0,Add);
              cat<std::__cxx11::string,char[4],std::__cxx11::string>
                        (&local_f0,(wabt *)local_d0._0_8_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" + ",
                         (char (*) [4])&local_138,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_register_00000084,OVar20.enum_));
              std::__cxx11::string::operator=((string *)&local_138,(string *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
                  &local_f0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_f0._M_dataplus._M_p._4_4_,
                                         local_f0._M_dataplus._M_p._0_4_),
                                local_f0.field_2._M_allocated_capacity + 1);
              }
            }
            DecompileExpr((Value *)&local_f0,this,
                          (addr_exp->children).
                          super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                          super__Vector_impl_data._M_start,addr_exp);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::_M_move_assign(&val->v,&local_f0);
            val->precedence = local_f0.field_2._8_4_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_f0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0);
        }
        goto LAB_0013750b;
      }
LAB_00137815:
      __function = 
      "const Derived *wabt::cast(const Base *) [Derived = wabt::ConstExpr, Base = wabt::Expr]";
LAB_001377f3:
      __assert_fail("isa<Derived>(base)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/cast.h"
                    ,0x48,__function);
    }
LAB_0013750b:
    BracketIfNeeded(this,val,Indexing);
    cat<char[2],std::__cxx11::string,char[2]>
              ((string *)local_d0,(wabt *)0x163ddb,(char (*) [2])&local_138,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15c5d1,
               (char (*) [2])CONCAT44(in_register_00000084,OVar20.enum_));
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_d0._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
    }
    if (local_80 == 0) {
      local_f0._M_dataplus._M_p._0_4_ = opc.enum_;
      if ((op_type.enum_ & I64) == I64) {
        Opcode::GetInfo((Info *)local_d0,(Opcode *)&local_f0);
        uVar8 = local_d0._0_8_;
        sVar13 = strlen((char *)local_d0._0_8_);
        if (sVar13 < 2) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     sVar13 - 2,sVar13);
          goto LAB_00137815;
        }
        EVar11 = I16;
        sVar1 = *(short *)(uVar8 + (sVar13 - 2));
        Opcode::GetInfo((Info *)local_d0,(Opcode *)&local_f0);
        if (local_a0 == 4) {
          EVar22 = I32;
          EVar11 = I32U;
LAB_00137636:
          if (sVar1 != 0x755f) {
            EVar11 = EVar22;
          }
          bVar14 = false;
        }
        else if (local_a0 == 2) {
          if (sVar1 == 0x755f) {
            EVar11 = I16U;
          }
          bVar14 = false;
        }
        else {
          if (local_a0 == 1) {
            EVar22 = I8;
            EVar11 = I8U;
            goto LAB_00137636;
          }
          bVar14 = true;
          EVar11 = Any;
        }
        if (bVar14) goto LAB_00137646;
      }
      else {
LAB_00137646:
        EVar11 = op_type.enum_;
      }
      switch(EVar11) {
      case I8U:
        local_38 = "ubyte";
        break;
      case I16U:
        local_38 = "ushort";
        break;
      case I32U:
        local_38 = "uint";
        break;
      case ExternRef:
        local_38 = "externref";
        break;
      case FuncRef:
        local_38 = "funcref";
        break;
      case 0xfffffff1:
      case 0xfffffff2:
      case 0xfffffff3:
      case FuncRef|I8U:
      case 0xfffffff5:
      case FuncRef|I16U:
      case FuncRef|I32U:
      case ~I32U:
      case Any:
      case ~I64:
      case ~F32:
      case ~F64:
      case ~I8:
switchD_0013765f_caseD_fffffff1:
        local_38 = "ILLEGAL";
        break;
      case I16:
        local_38 = "short";
        break;
      case I8:
        local_38 = "byte";
        break;
      case V128:
        local_38 = "simd";
        break;
      case F64:
        local_38 = "double";
        break;
      case F32:
        local_38 = "float";
        break;
      case I64:
        local_38 = "long";
        break;
      case I32:
        local_38 = "int";
        break;
      default:
        if (EVar11 == Void) {
          local_38 = "void";
        }
        else {
          if (EVar11 != Func) goto switchD_0013765f_caseD_fffffff1;
          local_38 = "func";
        }
      }
      LoadStoreTracking::GenAlign_abi_cxx11_(&local_f0,local_88,align,opc);
      cat<char[2],char_const*,std::__cxx11::string>
                ((string *)local_d0,(wabt *)":",(char (*) [2])&local_38,(char **)&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000084,OVar20.enum_));
      std::__cxx11::string::_M_append
                ((char *)((val->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1),local_d0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_d0 + 0x10)) {
        operator_delete((void *)local_d0._0_8_,(ulong)(local_d0._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_) !=
          &local_f0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_f0._M_dataplus._M_p._4_4_,local_f0._M_dataplus._M_p._0_4_),
                        local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    val->precedence = Indexing;
    _Var19._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001377ab;
  }
  else {
    BracketIfNeeded(this,val,Indexing);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,"."
                   ,&local_58);
    std::__cxx11::string::_M_append
              ((char *)((val->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1),local_d0._0_8_);
    local_138.field_2._M_allocated_capacity = local_d0._16_8_;
    _Var19._M_p = (pointer)local_d0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) goto LAB_001377ab;
  }
  operator_delete(_Var19._M_p,
                  (ulong)((long)&(((pointer)local_138.field_2._M_allocated_capacity)->_M_dataplus).
                                 _M_p + 1));
LAB_001377ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void LoadStore(Value& val,
                 const Node& addr_exp,
                 uint64_t offset,
                 Opcode opc,
                 Address align,
                 Type op_type) {
    bool append_type = true;
    auto access = lst.GenAccess(offset, addr_exp);
    if (!access.empty()) {
      if (access == "*") {
        // The variable was declared as a typed pointer, so this access
        // doesn't need a type.
        append_type = false;
      } else {
        // We can do this load/store as a struct access.
        BracketIfNeeded(val, Precedence::Indexing);
        val.v.back() += "." + access;
        return;
      }
    }
    // Detect absolute addressing, which we try to turn into references to the
    // data section when possible.
    uint64_t abs_base;
    if (ConstIntVal(addr_exp.e, abs_base)) {
      // We don't care what part of the absolute address was stored where,
      // 1[0] and 0[1] are the same.
      abs_base += offset;
      // FIXME: make this less expensive with a binary search or whatever.
      for (auto dat : mc.module.data_segments) {
        uint64_t dat_base;
        if (dat->offset.size() == 1 &&
            ConstIntVal(&dat->offset.front(), dat_base) &&
            abs_base >= dat_base && abs_base < dat_base + dat->data.size()) {
          // We are inside the range of this data segment!
          // Turn expression into data_name[index]
          val = Value{{dat->name}, Precedence::Atomic};
          // The new offset is from the start of the data segment, instead of
          // whatever it was.. this may be a different value from both the
          // original const and offset!
          offset = abs_base - dat_base;
        }
      }
    }
    // Do the load/store as a generalized indexing operation.
    // The offset is divisible by the alignment in 99.99% of
    // cases, but the spec doesn't guarantee it, so we must
    // have a backup syntax.
    auto index = offset % align == 0
                     ? std::to_string(offset / align)
                     : cat(std::to_string(offset), "@", std::to_string(align));
    // Detect the very common case of (base + (index << 2))[0]:int etc.
    // so we can instead do base[index]:int
    // TODO: (index << 2) on the left of + occurs also.
    // TODO: sadly this does not address cases where the shift amount > align.
    // (which happens for arrays of structs or arrays of long (with align=4)).
    // TODO: also very common is (v = base + (index << 2))[0]:int
    if (addr_exp.etype == ExprType::Binary) {
      auto& pe = *cast<BinaryExpr>(addr_exp.e);
      auto& shift_exp = addr_exp.children[1];
      if (pe.opcode == Opcode::I32Add && shift_exp.etype == ExprType::Binary) {
        auto& se = *cast<BinaryExpr>(shift_exp.e);
        auto& const_exp = shift_exp.children[1];
        if (se.opcode == Opcode::I32Shl && const_exp.etype == ExprType::Const) {
          auto& ce = *cast<ConstExpr>(const_exp.e);
          if (ce.const_.type() == Type::I32 &&
              (1ULL << ce.const_.u32()) == align) {
            // Pfew, case detected :( Lets re-write this in Haskell.
            // TODO: we're decompiling these twice.
            // The thing to the left of << is going to be part of the index.
            auto ival = DecompileExpr(shift_exp.children[0], &shift_exp);
            if (ival.v.size() == 1) {  // Don't bother if huge.
              if (offset == 0) {
                index = ival.v[0];
              } else {
                BracketIfNeeded(ival, Precedence::Add);
                index = cat(ival.v[0], " + ", index);
              }
              // We're going to use the thing to the left of + as the new
              // base address:
              val = DecompileExpr(addr_exp.children[0], &addr_exp);
            }
          }
        }
      }
    }
    BracketIfNeeded(val, Precedence::Indexing);
    val.v.back() += cat("[", index, "]");
    if (append_type) {
      val.v.back() += cat(":", GetDecompTypeName(GetMemoryType(op_type, opc)),
                          lst.GenAlign(align, opc));
    }
    val.precedence = Precedence::Indexing;
  }